

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3bc320::LaneBasedExecutionQueue::addJob
          (LaneBasedExecutionQueue *this,QueueJob *job,QueueJobPriority priority)

{
  int iVar1;
  pointer pSVar2;
  undefined4 extraout_var;
  QueueJob local_80;
  QueueJob local_58;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  uint64_t readyJobsCount;
  QueueJobPriority priority_local;
  QueueJob *job_local;
  LaneBasedExecutionQueue *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->readyJobsMutex);
  if (priority == High) {
    llbuild::basic::QueueJob::QueueJob(&local_58,job);
    FifoScheduler::addJob(&this->readyPriorityJobs,&local_58);
    llbuild::basic::QueueJob::~QueueJob(&local_58);
  }
  else {
    pSVar2 = std::
             unique_ptr<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
             ::operator->(&this->readyJobs);
    llbuild::basic::QueueJob::QueueJob(&local_80,job);
    (*pSVar2->_vptr_Scheduler[2])(pSVar2,&local_80);
    llbuild::basic::QueueJob::~QueueJob(&local_80);
  }
  std::condition_variable::notify_one();
  pSVar2 = std::
           unique_ptr<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
           ::operator->(&this->readyJobs);
  iVar1 = (*pSVar2->_vptr_Scheduler[5])();
  guard._M_device = (mutex_type *)CONCAT44(extraout_var,iVar1);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  llbuild::TracingExecutionQueueDepth((uint64_t)guard._M_device);
  return;
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority priority) override {
    uint64_t readyJobsCount;
    {
      std::lock_guard<std::mutex> guard(readyJobsMutex);
      if (priority == QueueJobPriority::High) {
        readyPriorityJobs.addJob(job);
      } else {
        readyJobs->addJob(job);
      }
      readyJobsCondition.notify_one();
      readyJobsCount = readyJobs->size();
    }
    TracingExecutionQueueDepth(readyJobsCount);
  }